

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

uint8 * resample_row_hv_2(uint8 *out,uint8 *in_near,uint8 *in_far,int w,int hs)

{
  byte bVar1;
  uint8 uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  bVar1 = *in_near;
  uVar3 = (uint)*in_far;
  if (w == 1) {
    uVar2 = (uint8)((uint)bVar1 + (uint)bVar1 * 2 + uVar3 + 2 >> 2);
    out[1] = uVar2;
    *out = uVar2;
  }
  else {
    iVar4 = (uint)bVar1 + (uint)bVar1 * 2;
    *out = (uint8)(iVar4 + uVar3 + 2 >> 2);
    iVar4 = iVar4 + uVar3;
    for (lVar5 = 1; lVar5 < w; lVar5 = lVar5 + 1) {
      iVar6 = (uint)in_far[lVar5] + (uint)in_near[lVar5] + (uint)in_near[lVar5] * 2;
      out[lVar5 * 2 + -1] = (uint8)(iVar4 * 3 + iVar6 + 8U >> 4);
      out[lVar5 * 2] = (uint8)(iVar4 + iVar6 * 3 + 8U >> 4);
      iVar4 = iVar6;
    }
    out[(long)w * 2 + -1] = (uint8)(iVar4 + 2U >> 2);
  }
  return out;
}

Assistant:

static uint8 *resample_row_hv_2(uint8 *out, uint8 *in_near, uint8 *in_far, int w, int hs)
{
   // need to generate 2x2 samples for every one in input
   int i,t0,t1;
   if (w == 1) {
      out[0] = out[1] = div4(3*in_near[0] + in_far[0] + 2);
      return out;
   }

   t1 = 3*in_near[0] + in_far[0];
   out[0] = div4(t1+2);
   for (i=1; i < w; ++i) {
      t0 = t1;
      t1 = 3*in_near[i]+in_far[i];
      out[i*2-1] = div16(3*t0 + t1 + 8);
      out[i*2  ] = div16(3*t1 + t0 + 8);
   }
   out[w*2-1] = div4(t1+2);
   return out;
}